

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstructionFolder::FoldIntegerOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  
  bVar1 = IsFoldableOpcode(this,inst->opcode_);
  if (!bVar1) {
    __assert_fail("IsFoldableOpcode(inst->opcode()) && \"Unhandled instruction opcode in FoldScalars\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x1d2,
                  "bool spvtools::opt::InstructionFolder::FoldIntegerOpToConstant(Instruction *, const std::function<uint32_t (uint32_t)> &, uint32_t *) const"
                 );
  }
  uVar3 = Instruction::NumInOperands(inst);
  if (uVar3 == 2) {
    bVar2 = FoldBinaryIntegerOpToConstant(this,inst,id_map,result);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = FoldBinaryBooleanOpToConstant(this,inst,id_map,result);
      return bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool InstructionFolder::FoldIntegerOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  assert(IsFoldableOpcode(inst->opcode()) &&
         "Unhandled instruction opcode in FoldScalars");
  switch (inst->NumInOperands()) {
    case 2:
      return FoldBinaryIntegerOpToConstant(inst, id_map, result) ||
             FoldBinaryBooleanOpToConstant(inst, id_map, result);
    default:
      return false;
  }
}